

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flv.c
# Opt level: O0

int flvtag_addcaption_scc(flvtag_t *tag,scc_t *scc)

{
  uint32_t uVar1;
  int iVar2;
  scc_t *in_stack_00000068;
  sei_t *in_stack_00000070;
  undefined1 local_30 [4];
  int ret;
  sei_t sei;
  scc_t *scc_local;
  flvtag_t *tag_local;
  
  sei.tail = (sei_message_t *)scc;
  uVar1 = flvtag_pts(tag);
  sei_init((sei_t *)local_30,(double)uVar1);
  sei_from_scc(in_stack_00000070,in_stack_00000068);
  iVar2 = flvtag_addsei(tag,(sei_t *)local_30);
  sei_free(_local_30);
  return iVar2;
}

Assistant:

int flvtag_addcaption_scc(flvtag_t* tag, const scc_t* scc)
{
    sei_t sei;
    sei_init(&sei, flvtag_pts(tag));
    sei_from_scc(&sei, scc);
    int ret = flvtag_addsei(tag, &sei);
    sei_free(&sei);
    return ret;
}